

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

void render_svg(element_t *element,render_context_t *context,render_state_t *state)

{
  render_context_t *context_00;
  float x_00;
  float y_00;
  float width;
  float height;
  length_t h;
  length_t w;
  length_t y;
  length_t x;
  length_t local_58;
  length_t local_50;
  length_t local_48;
  length_t local_40;
  render_context_t *local_38;
  
  if (element->parent == (element *)0x0) {
    width = context->document->width;
    x_00 = 0.0;
    y_00 = 0.0;
    context_00 = context;
    height = context->document->height;
  }
  else {
    local_40.value = 0.0;
    local_40.type = length_type_fixed;
    local_48.value = 0.0;
    local_48.type = length_type_fixed;
    local_50.value = 100.0;
    local_50.type = length_type_percent;
    local_58.value = 100.0;
    local_58.type = length_type_percent;
    local_38 = context;
    parse_length(element,0x2a,&local_40,true,false);
    parse_length(element,0x2d,&local_48,true,false);
    parse_length(element,0x29,&local_50,false,false);
    parse_length(element,0x10,&local_58,false,false);
    x_00 = local_40.value;
    if (local_40.type == length_type_percent) {
      x_00 = (state->view_width * local_40.value) / 100.0;
    }
    y_00 = local_48.value;
    if (local_48.type == length_type_percent) {
      y_00 = (state->view_height * local_48.value) / 100.0;
    }
    width = local_50.value;
    if (local_50.type == length_type_percent) {
      width = (state->view_width * local_50.value) / 100.0;
    }
    context_00 = local_38;
    height = local_58.value;
    if (local_58.type == length_type_percent) {
      height = (state->view_height * local_58.value) / 100.0;
    }
  }
  render_symbol(element,context_00,state,x_00,y_00,width,height);
  return;
}

Assistant:

static void render_svg(const element_t* element, const render_context_t* context, render_state_t* state)
{
    if(element->parent == NULL) {
        render_symbol(element, context, state, 0.f, 0.f, context->document->width, context->document->height);
        return;
    }

    length_t x = {0, length_type_fixed};
    length_t y = {0, length_type_fixed};

    length_t w = {100, length_type_percent};
    length_t h = {100, length_type_percent};

    parse_length(element, ATTR_X, &x, true, false);
    parse_length(element, ATTR_Y, &y, true, false);
    parse_length(element, ATTR_WIDTH, &w, false, false);
    parse_length(element, ATTR_HEIGHT, &h, false, false);

    float _x = resolve_length(state, &x, 'x');
    float _y = resolve_length(state, &y, 'y');
    float _w = resolve_length(state, &w, 'x');
    float _h = resolve_length(state, &h, 'y');
    render_symbol(element, context, state, _x, _y, _w, _h);
}